

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O2

void __thiscall
deqp::gls::FboUtil::ValidStatusCodes::logLegalResults(ValidStatusCodes *this,TestLog *log)

{
  ostringstream *this_00;
  pointer pRVar1;
  char *pcVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  allocator<char> local_209;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  validResults;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  MessageBuilder msg;
  
  msg.m_log = log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg.m_str);
  validResults.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  validResults.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  validResults.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar7 = 0;
  for (lVar3 = 0;
      pRVar1 = (this->m_errorCodes).
               super__Vector_base<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
               ._M_impl.super__Vector_impl_data._M_start,
      lVar3 < (int)(((long)(this->m_errorCodes).
                           super__Vector_base<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1) / 0x38);
      lVar3 = lVar3 + 1) {
    pcVar2 = glu::getErrorName(*(int *)((long)&pRVar1->errorCode + lVar7));
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,pcVar2,&local_209);
    std::operator+(&local_1f0,&local_1d0," (during FBO initialization)");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&validResults,
               &local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_1d0);
    lVar7 = lVar7 + 0x38;
  }
  lVar3 = 0;
  for (lVar7 = 0;
      pRVar1 = (this->m_errorStatuses).
               super__Vector_base<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
               ._M_impl.super__Vector_impl_data._M_start,
      lVar7 < (int)(((long)(this->m_errorStatuses).
                           super__Vector_base<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation,_std::allocator<deqp::gls::FboUtil::ValidStatusCodes::RuleViolation>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar1) / 0x38);
      lVar7 = lVar7 + 1) {
    pcVar2 = glu::getFramebufferStatusName(*(int *)((long)&pRVar1->errorCode + lVar3));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,pcVar2,(allocator<char> *)&local_1d0);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&validResults,
               &local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
    lVar3 = lVar3 + 0x38;
  }
  this_00 = &msg.m_str;
  if (this->m_allowComplete != false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,"GL_FRAMEBUFFER_COMPLETE",(allocator<char> *)&local_1d0);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&validResults,
               &local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
  }
  std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,"Expected ");
  if (0x20 < (ulong)((long)validResults.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)validResults.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,"one of ");
  }
  lVar3 = 0;
  uVar4 = 0;
  while( true ) {
    uVar6 = (ulong)((long)validResults.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)validResults.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 5;
    if ((long)(int)uVar6 <= (long)uVar4) break;
    std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,
                    (string *)
                    ((long)&((validResults.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar3)
                   );
    uVar6 = uVar6 & 0xffffffff;
    uVar5 = uVar4 + 2;
    uVar4 = uVar4 + 1;
    if (uVar4 != uVar6) {
      pcVar2 = " or ";
      if (uVar5 != uVar6) {
        pcVar2 = ", ";
      }
      std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,pcVar2);
    }
    lVar3 = lVar3 + 0x20;
  }
  std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,".");
  tcu::MessageBuilder::operator<<(&msg,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&validResults);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  return;
}

Assistant:

void ValidStatusCodes::logLegalResults (tcu::TestLog& log) const
{
	tcu::MessageBuilder			msg				(&log);
	std::vector<std::string>	validResults;

	for (int ndx = 0; ndx < (int)m_errorCodes.size(); ++ndx)
		validResults.push_back(std::string(glu::getErrorName(m_errorCodes[ndx].errorCode)) + " (during FBO initialization)");

	for (int ndx = 0; ndx < (int)m_errorStatuses.size(); ++ndx)
		validResults.push_back(glu::getFramebufferStatusName(m_errorStatuses[ndx].errorCode));

	if (m_allowComplete)
		validResults.push_back("GL_FRAMEBUFFER_COMPLETE");

	msg << "Expected ";
	if (validResults.size() > 1)
		msg << "one of ";

	for (int ndx = 0; ndx < (int)validResults.size(); ++ndx)
	{
		const bool last			= ((ndx + 1) == (int)validResults.size());
		const bool secondToLast	= ((ndx + 2) == (int)validResults.size());

		msg << validResults[ndx];
		if (!last)
			msg << ((secondToLast) ? (" or ") : (", "));
	}

	msg << "." << TestLog::EndMessage;
}